

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_stbvorbis_read_pcm_frames
                    (ma_stbvorbis *pVorbis,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  ma_uint32 *pmVar1;
  uint uVar2;
  uint uVar3;
  ma_uint32 channels;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var4;
  int iVar5;
  ma_result mVar6;
  ma_result mVar7;
  ulong uVar8;
  ma_uint8 *pmVar9;
  size_t sVar10;
  ulong uVar11;
  size_t __n;
  ma_uint64 framesRemaining;
  size_t sVar12;
  ulong uVar13;
  float *pFramesOutF32;
  ma_uint64 mVar14;
  int samplesRead;
  ulong local_50;
  void *local_48;
  ma_uint64 *local_40;
  size_t bytesRead;
  
  if (pFramesRead != (ma_uint64 *)0x0) {
    *pFramesRead = 0;
  }
  if (pVorbis == (ma_stbvorbis *)0x0 || frameCount == 0) {
    mVar7 = MA_INVALID_ARGS;
  }
  else {
    if (pVorbis->format == ma_format_f32) {
      local_50 = frameCount;
      local_48 = pFramesOut;
      if (pVorbis->usingPushMode == 0) {
        channels = pVorbis->channels;
        uVar11 = 0;
        local_40 = pFramesRead;
        do {
          uVar8 = local_50 - uVar11;
          pFramesRead = local_40;
          if (local_50 < uVar11 || uVar8 == 0) break;
          if (0x7ffffffe < uVar8) {
            uVar8 = 0x7fffffff;
          }
          iVar5 = stb_vorbis_get_samples_float_interleaved
                            (pVorbis->stb,channels,
                             (float *)(uVar11 * (channels * 4) + (long)local_48),
                             channels * (int)uVar8);
          uVar11 = uVar11 + (long)iVar5;
          pFramesRead = local_40;
        } while ((int)uVar8 <= iVar5);
      }
      else {
        mVar14 = 0;
LAB_001685a5:
        uVar8 = local_50 - mVar14;
        uVar11 = mVar14;
        if (mVar14 <= local_50 && uVar8 != 0) {
          uVar2 = (pVorbis->push).framesRemaining;
          uVar11 = uVar8 & 0xffffffff;
          if (uVar2 < uVar8) {
            uVar11 = (ulong)uVar2;
          }
          if (local_48 != (void *)0x0) {
            for (uVar8 = 0; uVar8 != uVar11; uVar8 = uVar8 + 1) {
              uVar3 = pVorbis->channels;
              for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
                *(float *)((long)pFramesOut + uVar13 * 4) =
                     (pVorbis->push).ppPacketData[uVar13][uVar8 + (pVorbis->push).framesConsumed];
              }
              pFramesOut = (void *)((long)pFramesOut + (ulong)uVar3 * 4);
            }
          }
          pmVar1 = &(pVorbis->push).framesConsumed;
          *pmVar1 = *pmVar1 + (int)uVar11;
          (pVorbis->push).framesRemaining = uVar2 - (int)uVar11;
          mVar14 = mVar14 + uVar11;
          uVar11 = local_50;
          if (mVar14 == local_50) goto LAB_001687ac;
          uVar11 = (pVorbis->push).dataSize;
          while (samplesRead = 0, uVar11 < 0x80000000) {
            iVar5 = stb_vorbis_decode_frame_pushdata
                              (pVorbis->stb,(pVorbis->push).pData,(int)uVar11,(int *)0x0,
                               &(pVorbis->push).ppPacketData,&samplesRead);
            if (iVar5 != 0) {
              pmVar9 = (pVorbis->push).pData;
              __n = (pVorbis->push).dataSize - (long)iVar5;
              (pVorbis->push).dataSize = __n;
              memmove(pmVar9,pmVar9 + iVar5,__n);
              (pVorbis->push).framesConsumed = 0;
              (pVorbis->push).framesRemaining = samplesRead;
              break;
            }
            sVar10 = (pVorbis->push).dataSize;
            sVar12 = (pVorbis->push).dataCapacity;
            if (sVar12 == sVar10) {
              p_Var4 = (pVorbis->allocationCallbacks).onRealloc;
              if (p_Var4 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
                sVar12 = sVar12 + 0x1000;
                pmVar9 = (ma_uint8 *)
                         (*p_Var4)((pVorbis->push).pData,sVar12,
                                   (pVorbis->allocationCallbacks).pUserData);
                if (pmVar9 != (ma_uint8 *)0x0) {
                  (pVorbis->push).pData = pmVar9;
                  (pVorbis->push).dataCapacity = sVar12;
                  sVar10 = (pVorbis->push).dataSize;
                  goto LAB_001686cc;
                }
              }
              mVar6 = MA_OUT_OF_MEMORY;
              goto LAB_001687b5;
            }
            pmVar9 = (pVorbis->push).pData;
LAB_001686cc:
            mVar6 = (*pVorbis->onRead)(pVorbis->pReadSeekTellUserData,pmVar9 + sVar10,
                                       sVar12 - sVar10,&bytesRead);
            uVar11 = (pVorbis->push).dataSize + bytesRead;
            (pVorbis->push).dataSize = uVar11;
            if (mVar6 != MA_SUCCESS) goto LAB_001687b5;
          }
          goto LAB_001685a5;
        }
      }
LAB_001687ac:
      mVar6 = MA_SUCCESS;
      mVar14 = uVar11;
    }
    else {
      mVar6 = MA_INVALID_ARGS;
      mVar14 = 0;
    }
LAB_001687b5:
    pVorbis->cursor = pVorbis->cursor + mVar14;
    mVar7 = MA_AT_END;
    if (mVar14 != 0) {
      mVar7 = mVar6;
    }
    if (pFramesRead != (ma_uint64 *)0x0) {
      *pFramesRead = mVar14;
    }
  }
  return mVar7;
}

Assistant:

MA_API ma_result ma_stbvorbis_read_pcm_frames(ma_stbvorbis* pVorbis, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pVorbis == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_VORBIS)
    {
        /* We always use floating point format. */
        ma_result result = MA_SUCCESS;  /* Must be initialized to MA_SUCCESS. */
        ma_uint64 totalFramesRead = 0;
        ma_format format;
        ma_uint32 channels;

        ma_stbvorbis_get_data_format(pVorbis, &format, &channels, NULL, NULL, 0);

        if (format == ma_format_f32) {
            /* We read differently depending on whether or not we're using push mode. */
            if (pVorbis->usingPushMode) {
                /* Push mode. This is the complex case. */
                float* pFramesOutF32 = (float*)pFramesOut;

                while (totalFramesRead < frameCount) {
                    /* The first thing to do is read from any already-cached frames. */
                    ma_uint32 framesToReadFromCache = (ma_uint32)ma_min(pVorbis->push.framesRemaining, (frameCount - totalFramesRead));  /* Safe cast because pVorbis->framesRemaining is 32-bit. */

                    /* The output pointer can be null in which case we just treat it as a seek. */
                    if (pFramesOut != NULL) {
                        ma_uint64 iFrame;
                        for (iFrame = 0; iFrame < framesToReadFromCache; iFrame += 1) {
                            ma_uint32 iChannel;
                            for (iChannel = 0; iChannel < pVorbis->channels; iChannel += 1) {
                                pFramesOutF32[iChannel] = pVorbis->push.ppPacketData[iChannel][pVorbis->push.framesConsumed + iFrame];
                            }

                            pFramesOutF32 += pVorbis->channels;
                        }
                    }

                    /* Update pointers and counters. */
                    pVorbis->push.framesConsumed  += framesToReadFromCache;
                    pVorbis->push.framesRemaining -= framesToReadFromCache;
                    totalFramesRead               += framesToReadFromCache;

                    /* Don't bother reading any more frames right now if we've just finished loading. */
                    if (totalFramesRead == frameCount) {
                        break;
                    }

                    MA_ASSERT(pVorbis->push.framesRemaining == 0);

                    /* Getting here means we've run out of cached frames. We'll need to load some more. */
                    for (;;) {
                        int samplesRead = 0;
                        int consumedDataSize;

                        /* We need to case dataSize to an int, so make sure we can do it safely. */
                        if (pVorbis->push.dataSize > INT_MAX) {
                            break;  /* Too big. */
                        }

                        consumedDataSize = stb_vorbis_decode_frame_pushdata(pVorbis->stb, pVorbis->push.pData, (int)pVorbis->push.dataSize, NULL, &pVorbis->push.ppPacketData, &samplesRead);
                        if (consumedDataSize != 0) {
                            /* Successfully decoded a Vorbis frame. Consume the data. */
                            pVorbis->push.dataSize -= (size_t)consumedDataSize;
                            MA_MOVE_MEMORY(pVorbis->push.pData, ma_offset_ptr(pVorbis->push.pData, consumedDataSize), pVorbis->push.dataSize);

                            pVorbis->push.framesConsumed  = 0;
                            pVorbis->push.framesRemaining = samplesRead;

                            break;
                        } else {
                            /* Not enough data. Read more. */
                            size_t bytesRead;

                            /* Expand the data buffer if necessary. */
                            if (pVorbis->push.dataCapacity == pVorbis->push.dataSize) {
                                size_t newCap = pVorbis->push.dataCapacity + MA_VORBIS_DATA_CHUNK_SIZE;
                                ma_uint8* pNewData;

                                pNewData = (ma_uint8*)ma_realloc(pVorbis->push.pData, newCap, &pVorbis->allocationCallbacks);
                                if (pNewData == NULL) {
                                    result = MA_OUT_OF_MEMORY;
                                    break;
                                }

                                pVorbis->push.pData = pNewData;
                                pVorbis->push.dataCapacity = newCap;
                            }

                            /* We should have enough room to load some data. */
                            result = pVorbis->onRead(pVorbis->pReadSeekTellUserData, ma_offset_ptr(pVorbis->push.pData, pVorbis->push.dataSize), (pVorbis->push.dataCapacity - pVorbis->push.dataSize), &bytesRead);
                            pVorbis->push.dataSize += bytesRead;

                            if (result != MA_SUCCESS) {
                                break;  /* Failed to read any data. Get out. */
                            }
                        }
                    }

                    /* If we don't have a success code at this point it means we've encountered an error or the end of the file has been reached (probably the latter). */
                    if (result != MA_SUCCESS) {
                        break;
                    }
                }
            } else {
                /* Pull mode. This is the simple case, but we still need to run in a loop because stb_vorbis loves using 32-bit instead of 64-bit. */
                while (totalFramesRead < frameCount) {
                    ma_uint64 framesRemaining = (frameCount - totalFramesRead);
                    int framesRead;

                    if (framesRemaining > INT_MAX) {
                        framesRemaining = INT_MAX;
                    }

                    framesRead = stb_vorbis_get_samples_float_interleaved(pVorbis->stb, channels, (float*)ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, format, channels), (int)framesRemaining * channels);   /* Safe cast. */
                    totalFramesRead += framesRead;

                    if (framesRead < (int)framesRemaining) {
                        break;  /* Nothing left to read. Get out. */
                    }
                }
            }
        } else {
            result = MA_INVALID_ARGS;
        }

        pVorbis->cursor += totalFramesRead;

        if (totalFramesRead == 0) {
            result = MA_AT_END;
        }

        if (pFramesRead != NULL) {
            *pFramesRead = totalFramesRead;
        }

        if (result == MA_SUCCESS && totalFramesRead == 0) {
            result  = MA_AT_END;
        }

        return result;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)pFramesOut;
        (void)frameCount;
        (void)pFramesRead;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}